

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.cpp
# Opt level: O0

CMReturn * __thiscall
ConfusableMatcher::IndexOfDebugFailures
          (CMReturn *__return_storage_ptr__,ConfusableMatcher *this,string *In,string *Contains,
          CMOptions Options,vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *Failures)

{
  CMOptions Options_00;
  uint64_t uVar1;
  long lVar2;
  ulong uVar3;
  CMReturn *ret;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  void *pvStack_50;
  CMStringView local_48;
  CMStringView local_38;
  vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *local_28;
  vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *Failures_local;
  string *Contains_local;
  string *In_local;
  ConfusableMatcher *this_local;
  
  local_28 = Failures;
  Failures_local = (vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)Contains;
  Contains_local = In;
  In_local = (string *)this;
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0) {
    __return_storage_ptr__->Status = MATCH;
    __return_storage_ptr__->Start = 0;
    __return_storage_ptr__->Size = 0;
  }
  else {
    uVar1 = Options.StartIndex;
    uVar3 = std::__cxx11::string::size();
    if (uVar1 < uVar3) {
      std::experimental::fundamentals_v1::basic_string_view<char,std::char_traits<char>>::
      basic_string_view<std::allocator<char>>
                ((basic_string_view<char,std::char_traits<char>> *)&local_38,In);
      std::experimental::fundamentals_v1::basic_string_view<char,std::char_traits<char>>::
      basic_string_view<std::allocator<char>>
                ((basic_string_view<char,std::char_traits<char>> *)&local_48,Contains);
      memcpy(&local_78,&Options,0x30);
      Options_00.StartIndex = uStack_70;
      Options_00._0_8_ = local_78;
      Options_00._16_8_ = local_68;
      Options_00.TimeoutNs = uStack_60;
      Options_00._32_8_ = local_58;
      Options_00.ContainsPosPointers = pvStack_50;
      IndexOfFromView<(CMDebugLevel)1>
                (__return_storage_ptr__,this,local_38,local_48,Options_00,local_28);
    }
    else {
      __return_storage_ptr__->Status = NO_MATCH;
      __return_storage_ptr__->Start = 0;
      __return_storage_ptr__->Size = 0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CMReturn ConfusableMatcher::IndexOfDebugFailures(std::string In, std::string Contains, CMOptions Options, std::vector<CMDebugFailure>* Failures)
{
	if (Contains.size() == 0) {
		CMReturn ret;

		ret.Status = MATCH;
		ret.Start = 0;
		ret.Size = 0;
		return ret;
	}

	if (Options.StartIndex >= In.size() || Options.StartIndex < 0) {
		CMReturn ret;
		ret.Status = NO_MATCH;
		ret.Start = 0;
		ret.Size = 0;
		return ret;
	}

	return IndexOfFromView<DEBUG_LEVEL_FAILURES>(CMStringView(In), CMStringView(Contains), Options, Failures);
}